

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[29],char_const*,char[15],char[35],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[72]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [29],char **RestArgs,char (*RestArgs_1) [15],char (*RestArgs_2) [35]
               ,uint *RestArgs_3,char (*RestArgs_4) [15],char (*RestArgs_5) [23],uint *RestArgs_6,
               char (*RestArgs_7) [13],uint *RestArgs_8,char (*RestArgs_9) [72])

{
  uint *RestArgs_local_3;
  char (*RestArgs_local_2) [35];
  char (*RestArgs_local_1) [15];
  char **RestArgs_local;
  char (*FirstArg_local) [29];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[29]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[15],char[35],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[72]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7,RestArgs_8,RestArgs_9);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}